

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O3

uint32_t __thiscall SCSI::Target::CommandState::address(CommandState *this)

{
  pointer puVar1;
  uint uVar2;
  long lVar3;
  
  puVar1 = (this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if ((lVar3 == 0xc) || (lVar3 == 10)) {
    uVar2 = (uint)puVar1[3] << 8 | (uint)puVar1[2] << 0x10 | (uint)puVar1[1] << 0x18;
    lVar3 = 4;
  }
  else {
    if (lVar3 != 6) {
      return 0;
    }
    uVar2 = (uint)puVar1[2] << 8 | (uint)puVar1[1] << 0x10;
    lVar3 = 3;
  }
  return puVar1[lVar3] | uVar2;
}

Assistant:

uint32_t CommandState::address() const {
	switch(data_.size()) {
		default:	return 0;
		case 6:
			return
				(uint32_t(data_[1]) << 16) |
				(uint32_t(data_[2]) << 8) |
				uint32_t(data_[3]);
		case 10:
		case 12:
			return
				(uint32_t(data_[1]) << 24) |
				(uint32_t(data_[2]) << 16) |
				(uint32_t(data_[3]) << 8) |
				uint32_t(data_[4]);
	}
}